

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

BOOL __thiscall Js::RecyclableObjectDisplay::HasChildren(RecyclableObjectDisplay *this)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  JavascriptLibrary *this_00;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  undefined4 *puVar5;
  ScriptContext *__localScriptContext;
  void *unaff_retaddr;
  undefined1 auStack_98 [8];
  ScriptEntryExitRecord __entryExitRecord;
  undefined1 local_58 [8];
  EnterScriptObject __enterScriptObject;
  RecyclableObject *object;
  anon_class_8_1_6424947d funcPtr;
  
  bVar2 = VarIs<Js::RecyclableObject>(this->instance);
  if (!bVar2) {
    return 0;
  }
  __enterScriptObject.library = (JavascriptLibrary *)VarTo<Js::RecyclableObject>(this->instance);
  BVar3 = JavascriptOperators::IsObject((RecyclableObject *)__enterScriptObject.library);
  this_00 = __enterScriptObject.library;
  if (BVar3 == 0) {
LAB_008c2a4b:
    bVar2 = true;
  }
  else {
    if (__enterScriptObject.library == (JavascriptLibrary *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_008c2a68;
      *puVar5 = 0;
    }
    iVar4 = *(int *)&(((this_00->super_JavascriptLibraryBase).globalObject.ptr)->
                     super_RootObjectBase).super_DynamicObject.super_RecyclableObject.
                     super_FinalizableObject.super_IRecyclerVisitedObject.
                     _vptr_IRecyclerVisitedObject;
    if ((0x57 < iVar4) &&
       (BVar3 = RecyclableObject::IsExternal((RecyclableObject *)this_00), BVar3 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar2) {
LAB_008c2a68:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    if (iVar4 != 0x17) {
      object = (RecyclableObject *)&__enterScriptObject.library;
      scriptContext = this->scriptContext;
      if (scriptContext->threadContext->isScriptActive == false) {
        __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
        __entryExitRecord.scriptContext = (ScriptContext *)0x0;
        __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
        __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
        auStack_98 = (undefined1  [8])0x0;
        __entryExitRecord._0_1_ = 0;
        __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
        __entryExitRecord._2_6_ = 0;
        __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
        EnterScriptObject::EnterScriptObject
                  ((EnterScriptObject *)local_58,scriptContext,(ScriptEntryExitRecord *)auStack_98,
                   unaff_retaddr,&stack0x00000000,false,false,false);
        ScriptContext::OnScriptStart(scriptContext,false,true);
        EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_58);
        iVar4 = HasChildren::anon_class_8_1_6424947d::operator()((anon_class_8_1_6424947d *)&object)
        ;
        EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_58);
      }
      else {
        iVar4 = HasChildren::anon_class_8_1_6424947d::operator()((anon_class_8_1_6424947d *)&object)
        ;
      }
      if (iVar4 == 0) goto LAB_008c2a4b;
    }
    bVar2 = false;
  }
  if (bVar2) {
    return 0;
  }
  return 1;
}

Assistant:

BOOL RecyclableObjectDisplay::HasChildren()
    {
        if (Js::VarIs<Js::RecyclableObject>(instance))
        {
            Js::RecyclableObject* object = Js::VarTo<Js::RecyclableObject>(instance);

            if (JavascriptOperators::IsObject(object))
            {
                if (JavascriptOperators::GetTypeId(object) == TypeIds_HostDispatch)
                {
                    return TRUE;
                }

                try
                {
                    auto funcPtr = [&]()
                    {
                        IGNORE_STACKWALK_EXCEPTION(scriptContext);
                        if (object->IsExternal())
                        {
                            Js::ForInObjectEnumerator enumerator(object, object->GetScriptContext(), /* enumSymbols */ true);
                            Js::PropertyId propertyId;
                            if (enumerator.MoveAndGetNext(propertyId))
                            {
                                enumerator.Clear();
                                return TRUE;
                            }
                        }
                        else if (object->GetPropertyCount() > 0 || (JavascriptOperators::GetTypeId(object->GetPrototype()) != TypeIds_Null))
                        {
                            return TRUE;
                        }

                        return FALSE;
                    };

                    BOOL autoFuncReturn = FALSE;

                    if (!scriptContext->GetThreadContext()->IsScriptActive())
                    {
                        BEGIN_JS_RUNTIME_CALL_EX(scriptContext, false)
                        {
                            autoFuncReturn = funcPtr();
                        }
                        END_JS_RUNTIME_CALL(scriptContext);
                    }
                    else
                    {
                        autoFuncReturn = funcPtr();
                    }

                    if (autoFuncReturn == TRUE)
                    {
                        return TRUE;
                    }
                }
                catch (const JavascriptException& err)
                {
                    // The For in enumerator can throw an exception and we will use the error object as a child in that case.
                    Var error = err.GetAndClear()->GetThrownObject(scriptContext);
                    if (error != nullptr && Js::VarIs<Js::JavascriptError>(error))
                    {
                        return TRUE;
                    }
                    return FALSE;
                }
            }
        }

        return FALSE;
    }